

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_decoding_transform.h
# Opt level: O2

void __thiscall
draco::PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
          (PredictionSchemeWrapDecodingTransform<int,_int> *this,int *predicted_vals,int *corr_vals,
          int *out_original_vals)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  
  piVar2 = PredictionSchemeWrapTransformBase<int>::ClampPredictedValue
                     (&this->super_PredictionSchemeWrapTransformBase<int>,predicted_vals);
  lVar3 = 0;
  do {
    if ((this->super_PredictionSchemeWrapTransformBase<int>).num_components_ <= lVar3) {
      return;
    }
    iVar4 = corr_vals[lVar3] + piVar2[lVar3];
    out_original_vals[lVar3] = iVar4;
    if ((this->super_PredictionSchemeWrapTransformBase<int>).max_value_ < iVar4) {
      iVar1 = -(this->super_PredictionSchemeWrapTransformBase<int>).max_dif_;
LAB_00152c83:
      out_original_vals[lVar3] = iVar4 + iVar1;
    }
    else if (iVar4 < (this->super_PredictionSchemeWrapTransformBase<int>).min_value_) {
      iVar1 = (this->super_PredictionSchemeWrapTransformBase<int>).max_dif_;
      goto LAB_00152c83;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

inline void ComputeOriginalValue(const DataTypeT *predicted_vals,
                                   const CorrTypeT *corr_vals,
                                   DataTypeT *out_original_vals) const {
    // For now we assume both |DataTypeT| and |CorrTypeT| are equal.
    static_assert(std::is_same<DataTypeT, CorrTypeT>::value,
                  "Predictions and corrections must have the same type.");

    // The only valid implementation right now is for int32_t.
    static_assert(std::is_same<DataTypeT, int32_t>::value,
                  "Only int32_t is supported for predicted values.");

    predicted_vals = this->ClampPredictedValue(predicted_vals);

    // Perform the wrapping using unsigned coordinates to avoid potential signed
    // integer overflows caused by malformed input.
    const uint32_t *const uint_predicted_vals =
        reinterpret_cast<const uint32_t *>(predicted_vals);
    const uint32_t *const uint_corr_vals =
        reinterpret_cast<const uint32_t *>(corr_vals);
    for (int i = 0; i < this->num_components(); ++i) {
      out_original_vals[i] =
          static_cast<DataTypeT>(uint_predicted_vals[i] + uint_corr_vals[i]);
      if (out_original_vals[i] > this->max_value()) {
        out_original_vals[i] -= this->max_dif();
      } else if (out_original_vals[i] < this->min_value()) {
        out_original_vals[i] += this->max_dif();
      }
    }
  }